

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O0

bool deqp::egl::isAttributePresent(Version *version,EGLenum attribute)

{
  bool bVar1;
  Version local_34;
  Version local_2c;
  Version local_24;
  EGLenum local_1c;
  Version *pVStack_18;
  EGLenum attribute_local;
  Version *version_local;
  
  local_1c = attribute;
  pVStack_18 = version;
  if (attribute - 0x3039 < 4) {
LAB_017db9ec:
    eglu::Version::Version(&local_34,1,1);
    bVar1 = eglu::Version::operator<(version,&local_34);
    if (bVar1) {
      return false;
    }
  }
  else {
    if (2 < attribute - 0x303d) {
      if (attribute == 0x3040) goto LAB_017db9ec;
      if (attribute != 0x3041) {
        if (attribute != 0x3042) {
          return true;
        }
        eglu::Version::Version(&local_24,1,3);
        bVar1 = eglu::Version::operator<(version,&local_24);
        if (!bVar1) {
          return true;
        }
        return false;
      }
    }
    eglu::Version::Version(&local_2c,1,2);
    bVar1 = eglu::Version::operator<(version,&local_2c);
    if (bVar1) {
      return false;
    }
  }
  return true;
}

Assistant:

static bool isAttributePresent (const eglu::Version& version, EGLenum attribute)
{
	switch (attribute)
	{
		case EGL_CONFORMANT:
			if (version < eglu::Version(1, 3)) return false;
			break;
		case EGL_LUMINANCE_SIZE:
		case EGL_ALPHA_MASK_SIZE:
		case EGL_COLOR_BUFFER_TYPE:
		case EGL_MATCH_NATIVE_PIXMAP:
			if (version < eglu::Version(1, 2)) return false;
			break;
		case EGL_BIND_TO_TEXTURE_RGB:
		case EGL_BIND_TO_TEXTURE_RGBA:
		case EGL_MAX_SWAP_INTERVAL:
		case EGL_MIN_SWAP_INTERVAL:
		case EGL_RENDERABLE_TYPE:
			if (version < eglu::Version(1, 1)) return false;
			break;
		default:
			break;
	}

	return true;
}